

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool InputTextFilterCharacter
               (uint *p_char,ImGuiInputTextFlags flags,ImGuiInputTextCallback_conflict1 callback,
               void *user_data,ImGuiInputSource input_source)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ImGuiInputTextCallbackData_conflict local_40;
  
  if ((input_source != ImGuiInputSource_Keyboard) && (input_source != ImGuiInputSource_Clipboard)) {
    __assert_fail("input_source == ImGuiInputSource_Keyboard || input_source == ImGuiInputSource_Clipboard"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0xf11,
                  "bool InputTextFilterCharacter(unsigned int *, ImGuiInputTextFlags, ImGuiInputTextCallback, void *, ImGuiInputSource)"
                 );
  }
  uVar3 = *p_char;
  if (uVar3 < 0x20) {
    if ((((byte)((uint)flags >> 0x1a) & uVar3 == 10) == 0) &&
       (((uint)flags >> 10 & 1) == 0 || uVar3 != 9)) {
      return false;
    }
  }
  if (input_source == ImGuiInputSource_Clipboard) {
    if (0xffff < uVar3) {
      return false;
    }
  }
  else {
    if (0xffff < uVar3) {
      return false;
    }
    if (uVar3 == 0x7f) {
      return false;
    }
    if (uVar3 - 0xe000 < 0x1900) {
      return false;
    }
  }
  if ((flags & 0x2000fU) != 0 && 0x1f < uVar3) {
    uVar1 = uVar3 - 0x30;
    if ((9 < uVar1 && (flags & 1U) != 0) && (uVar3 != (int)GImGui->PlatformLocaleDecimalPoint)) {
      if (0x2f < uVar3) {
        return false;
      }
      if ((0xac0000000000U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
        return false;
      }
    }
    if ((((((uint)flags >> 0x11 & 1) != 0 && 9 < uVar1) && ((uVar3 & 0xffdf) != 0x45)) &&
        (uVar3 != 0x2f)) &&
       (((uVar3 - 0x2c < 0xfffffffe && (uVar3 != 0x2d)) &&
        (uVar3 != (int)GImGui->PlatformLocaleDecimalPoint)))) {
      return false;
    }
    if ((5 < uVar3 - 0x41 && (flags & 2U) != 0) && (5 < uVar3 - 0x61 && 9 < uVar1)) {
      return false;
    }
    if ((uVar3 - 0x61 < 0x1a & (byte)flags >> 2) == 1) {
      uVar3 = uVar3 - 0x20;
      *p_char = uVar3;
    }
    if ((flags & 8U) != 0) {
      if (uVar3 == 0x20) {
        return false;
      }
      if (uVar3 == 0x3000) {
        return false;
      }
    }
  }
  if (((uint)flags >> 9 & 1) == 0) {
    return true;
  }
  local_40.Buf = (char *)0x0;
  local_40.BufTextLen = 0;
  local_40.BufSize = 0;
  local_40.BufDirty = false;
  local_40._41_3_ = 0;
  local_40.CursorPos = 0;
  local_40.SelectionStart = 0;
  local_40.SelectionEnd = 0;
  local_40.EventFlag = 0x200;
  local_40._18_6_ = 0;
  local_40.EventChar = (ushort)uVar3;
  local_40.Flags = flags;
  local_40.UserData = user_data;
  iVar2 = (*callback)(&local_40);
  if (iVar2 == 0) {
    *p_char = (uint)local_40.EventChar;
    if (local_40.EventChar != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool InputTextFilterCharacter(unsigned int* p_char, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data, ImGuiInputSource input_source)
{
    IM_ASSERT(input_source == ImGuiInputSource_Keyboard || input_source == ImGuiInputSource_Clipboard);
    unsigned int c = *p_char;

    // Filter non-printable (NB: isprint is unreliable! see #2467)
    bool apply_named_filters = true;
    if (c < 0x20)
    {
        bool pass = false;
        pass |= (c == '\n' && (flags & ImGuiInputTextFlags_Multiline));
        pass |= (c == '\t' && (flags & ImGuiInputTextFlags_AllowTabInput));
        if (!pass)
            return false;
        apply_named_filters = false; // Override named filters below so newline and tabs can still be inserted.
    }

    if (input_source != ImGuiInputSource_Clipboard)
    {
        // We ignore Ascii representation of delete (emitted from Backspace on OSX, see #2578, #2817)
        if (c == 127)
            return false;

        // Filter private Unicode range. GLFW on OSX seems to send private characters for special keys like arrow keys (FIXME)
        if (c >= 0xE000 && c <= 0xF8FF)
            return false;
    }

    // Filter Unicode ranges we are not handling in this build
    if (c > IM_UNICODE_CODEPOINT_MAX)
        return false;

    // Generic named filters
    if (apply_named_filters && (flags & (ImGuiInputTextFlags_CharsDecimal | ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsUppercase | ImGuiInputTextFlags_CharsNoBlank | ImGuiInputTextFlags_CharsScientific)))
    {
        // The libc allows overriding locale, with e.g. 'setlocale(LC_NUMERIC, "de_DE.UTF-8");' which affect the output/input of printf/scanf.
        // The standard mandate that programs starts in the "C" locale where the decimal point is '.'.
        // We don't really intend to provide widespread support for it, but out of empathy for people stuck with using odd API, we support the bare minimum aka overriding the decimal point.
        // Change the default decimal_point with:
        //   ImGui::GetCurrentContext()->PlatformLocaleDecimalPoint = *localeconv()->decimal_point;
        ImGuiContext& g = *GImGui;
        const unsigned c_decimal_point = (unsigned int)g.PlatformLocaleDecimalPoint;

        // Allow 0-9 . - + * /
        if (flags & ImGuiInputTextFlags_CharsDecimal)
            if (!(c >= '0' && c <= '9') && (c != c_decimal_point) && (c != '-') && (c != '+') && (c != '*') && (c != '/'))
                return false;

        // Allow 0-9 . - + * / e E
        if (flags & ImGuiInputTextFlags_CharsScientific)
            if (!(c >= '0' && c <= '9') && (c != c_decimal_point) && (c != '-') && (c != '+') && (c != '*') && (c != '/') && (c != 'e') && (c != 'E'))
                return false;

        // Allow 0-9 a-F A-F
        if (flags & ImGuiInputTextFlags_CharsHexadecimal)
            if (!(c >= '0' && c <= '9') && !(c >= 'a' && c <= 'f') && !(c >= 'A' && c <= 'F'))
                return false;

        // Turn a-z into A-Z
        if (flags & ImGuiInputTextFlags_CharsUppercase)
            if (c >= 'a' && c <= 'z')
                *p_char = (c += (unsigned int)('A' - 'a'));

        if (flags & ImGuiInputTextFlags_CharsNoBlank)
            if (ImCharIsBlankW(c))
                return false;
    }

    // Custom callback filter
    if (flags & ImGuiInputTextFlags_CallbackCharFilter)
    {
        ImGuiInputTextCallbackData callback_data;
        memset(&callback_data, 0, sizeof(ImGuiInputTextCallbackData));
        callback_data.EventFlag = ImGuiInputTextFlags_CallbackCharFilter;
        callback_data.EventChar = (ImWchar)c;
        callback_data.Flags = flags;
        callback_data.UserData = user_data;
        if (callback(&callback_data) != 0)
            return false;
        *p_char = callback_data.EventChar;
        if (!callback_data.EventChar)
            return false;
    }

    return true;
}